

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenGlobalRef BinaryenGetGlobalByIndex(BinaryenModuleRef module,BinaryenIndex index)

{
  pointer puVar1;
  Fatal local_198;
  
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)index <
      (ulong)((long)(module->globals).
                    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return (BinaryenGlobalRef)
           ((_Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>)
           puVar1[index]._M_t.
           super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t).
           super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>;
  }
  wasm::Fatal::Fatal(&local_198);
  wasm::Fatal::operator<<(&local_198,(char (*) [22])"invalid global index.");
  wasm::Fatal::~Fatal(&local_198);
}

Assistant:

BinaryenGlobalRef BinaryenGetGlobalByIndex(BinaryenModuleRef module,
                                           BinaryenIndex index) {
  const auto& globals = ((Module*)module)->globals;
  if (globals.size() <= index) {
    Fatal() << "invalid global index.";
  }
  return globals[index].get();
}